

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emle.c
# Opt level: O3

double fcss_seas(double *b,int pq,void *params)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  int iVar7;
  uint uVar8;
  void *__dest;
  void *__dest_00;
  long lVar9;
  void *pvVar10;
  ulong uVar11;
  ulong uVar12;
  uint uVar13;
  long lVar14;
  long lVar15;
  uint uVar16;
  long lVar17;
  uint uVar18;
  double dVar19;
  double dVar20;
  
  uVar16 = *params;
  lVar17 = (long)(int)uVar16;
  iVar1 = *(int *)((long)params + 0xc);
  lVar9 = (long)iVar1;
  uVar2 = *(uint *)((long)params + 0x10);
  uVar13 = *(uint *)((long)params + 0x18);
  iVar7 = uVar2 * iVar1;
  uVar8 = iVar7 + uVar16;
  uVar3 = *(uint *)((long)params + 8);
  uVar18 = uVar13 * iVar1 + uVar3;
  uVar4 = *(uint *)((long)params + 0x28);
  iVar5 = *(int *)((long)params + 0x50);
  __dest = malloc((long)(int)uVar8 << 3);
  __dest_00 = malloc((long)(int)uVar18 << 3);
  if (0 < lVar17) {
    memcpy(__dest,b,(ulong)uVar16 * 8);
  }
  if (0 < iVar7) {
    uVar6 = uVar16 + 1;
    if ((int)(uVar16 + 1) < (int)uVar8) {
      uVar6 = uVar8;
    }
    memset((void *)((long)__dest + lVar17 * 8),0,(ulong)(~uVar16 + uVar6) * 8 + 8);
  }
  if (0 < (int)uVar3) {
    memcpy(__dest_00,b + lVar17,(ulong)uVar3 * 8);
  }
  if (0 < (int)(uVar13 * iVar1)) {
    uVar6 = uVar3 + 1;
    if ((int)(uVar3 + 1) < (int)uVar18) {
      uVar6 = uVar18;
    }
    memset((void *)((long)__dest_00 + (long)(int)uVar3 * 8),0,(ulong)(~uVar3 + uVar6) * 8 + 8);
  }
  if (0 < (int)uVar2) {
    pvVar10 = (void *)((long)__dest + lVar9 * 8);
    uVar11 = 0;
    do {
      dVar19 = b[(long)(int)(uVar3 + uVar16) + uVar11];
      uVar11 = uVar11 + 1;
      *(double *)((long)__dest + uVar11 * lVar9 * 8 + -8) =
           *(double *)((long)__dest + uVar11 * lVar9 * 8 + -8) + dVar19;
      if (0 < (int)uVar16) {
        uVar12 = 0;
        do {
          *(double *)((long)pvVar10 + uVar12 * 8) =
               *(double *)((long)pvVar10 + uVar12 * 8) - b[uVar12] * dVar19;
          uVar12 = uVar12 + 1;
        } while (uVar16 != uVar12);
      }
      pvVar10 = (void *)((long)pvVar10 + lVar9 * 8);
    } while (uVar11 != uVar2);
  }
  if (0 < (int)uVar13) {
    pvVar10 = (void *)((long)__dest_00 + lVar9 * 8);
    uVar11 = 0;
    do {
      dVar19 = b[(long)(int)(uVar3 + uVar16 + uVar2) + uVar11];
      uVar11 = uVar11 + 1;
      *(double *)((long)__dest_00 + uVar11 * lVar9 * 8 + -8) =
           *(double *)((long)__dest_00 + uVar11 * lVar9 * 8 + -8) + dVar19;
      if (0 < (int)uVar3) {
        uVar12 = 0;
        do {
          *(double *)((long)pvVar10 + uVar12 * 8) =
               b[lVar17 + uVar12] * dVar19 + *(double *)((long)pvVar10 + uVar12 * 8);
          uVar12 = uVar12 + 1;
        } while (uVar3 != uVar12);
      }
      pvVar10 = (void *)((long)pvVar10 + lVar9 * 8);
    } while (uVar11 != uVar13);
  }
  if (0 < (int)uVar8) {
    uVar11 = 0;
    do {
      *(undefined8 *)((long)params + uVar11 * 8 + (long)(int)(iVar5 + uVar4) * 8 + 0x58) = 0;
      uVar11 = uVar11 + 1;
    } while (uVar8 != uVar11);
  }
  if (0 < (int)uVar4 && *(int *)((long)params + 0x2c) == 1) {
    uVar11 = 0;
    do {
      *(double *)((long)params + uVar11 * 8 + (long)iVar5 * 8 + 0x58) =
           *(double *)((long)params + uVar11 * 8 + (long)(int)(iVar5 + uVar4 * 2) * 8 + 0x58) -
           b[(int)(uVar2 + uVar13 + uVar16 + uVar3)];
      uVar11 = uVar11 + 1;
    } while (uVar4 != uVar11);
  }
  dVar20 = 0.0;
  dVar19 = 0.0;
  if ((int)uVar8 < (int)uVar4) {
    lVar17 = iVar7 + lVar17;
    lVar9 = ((ulong)(iVar5 + uVar16 + iVar7) << 0x20) + -0x100000000;
    lVar15 = ((ulong)(iVar5 + uVar4 + (int)lVar17) << 0x20) + -0x100000000;
    uVar16 = 0;
    do {
      uVar2 = uVar18;
      if ((int)uVar16 < (int)uVar18) {
        uVar2 = uVar16;
      }
      dVar20 = *(double *)((long)params + (lVar17 + iVar5) * 8 + 0x58);
      if (0 < (int)uVar8) {
        uVar11 = 0;
        lVar14 = lVar9;
        do {
          dVar20 = dVar20 - *(double *)((long)__dest + uVar11 * 8) *
                            *(double *)((long)params + (lVar14 >> 0x1d) + 0x58);
          uVar11 = uVar11 + 1;
          lVar14 = lVar14 + -0x100000000;
        } while (uVar8 != uVar11);
      }
      uVar13 = (int)lVar17 - uVar8;
      if ((int)uVar18 <= (int)uVar13) {
        uVar13 = uVar18;
      }
      if (0 < (int)uVar13) {
        uVar11 = 0;
        lVar14 = lVar15;
        do {
          dVar20 = dVar20 - *(double *)((long)__dest_00 + uVar11 * 8) *
                            *(double *)((long)params + (lVar14 >> 0x1d) + 0x58);
          uVar11 = uVar11 + 1;
          lVar14 = lVar14 + -0x100000000;
        } while (uVar2 != uVar11);
      }
      uVar16 = uVar16 + 1;
      *(double *)((long)params + (lVar17 + (int)(iVar5 + uVar4)) * 8 + 0x58) = dVar20;
      dVar19 = dVar19 + dVar20 * dVar20;
      lVar17 = lVar17 + 1;
      lVar9 = lVar9 + 0x100000000;
      lVar15 = lVar15 + 0x100000000;
    } while (lVar17 < (int)uVar4);
    dVar20 = (double)(int)uVar16;
  }
  *(double *)((long)params + 0x40) = dVar19;
  dVar19 = log(dVar19 / dVar20);
  *(double *)((long)params + 0x48) = dVar19 * 0.5;
  free(__dest);
  free(__dest_00);
  return dVar19 * 0.5;
}

Assistant:

double fcss_seas(double *b, int pq, void *params) {
	double value, ssq,temp;
	int p, q, ps, qs, s, offset,jm;
	int ip, iq, i, j, N,iter,ncond;
	double *phi, *theta;

	value = ssq =  0.0;
	
	alik_css_seas_object obj = (alik_css_seas_object)params;

	ip = obj->p + (obj->s * obj->P);
	iq = obj->q + (obj->s * obj->Q);

	N = obj->N;
	p = obj->p;
	ps = obj->P;
	q = obj->q;
	qs = obj->Q;
	s = obj->s;
	offset = obj->offset;
	ncond = p + s* ps;

	//printf("\n %d %d %d \n", s,ps, qs);

	phi = (double*)malloc(sizeof(double)* ip);
	theta = (double*)malloc(sizeof(double)* iq);



	for (i = 0; i < p; ++i) {
		phi[i] = b[i];
	}

	for (i = p; i < ip; ++i) {
		phi[i] = 0.0;
	}

	for (i = 0; i < q; ++i) {
		theta[i] = b[i + p];
	}

	for (i = q; i < iq; ++i) {
		theta[i] = 0.0;
	}

	for (j = 0; j < ps; ++j) {
		phi[(j + 1)*s - 1] += b[p + q + j];
		for (i = 0; i < p; ++i) {
			phi[(j + 1)*s + i] -= b[i] * b[p + q + j];
		}
	}

	for (j = 0; j < qs; ++j) {
		theta[(j + 1)*s - 1] += b[p + q + ps + j];
		for (i = 0; i < q; ++i) {
			theta[(j + 1)*s + i] += b[i + p] * b[p + q + ps + j];
		}
	}
	//mdisplay(theta, 1, q + s*qs);
	//mdisplay(b, 1, p + q + ps + qs);
	for (i = 0; i < ncond; ++i) {
		obj->x[offset+N + i] = 0.0;
	}

	if (obj->M == 1) {
		for (i = 0; i < N; ++i) {
			obj->x[offset+i] = obj->x[offset+ 2 * N + i] - b[p+q+ps+qs];
		}
	}
	iter = 0;
	for (i = ncond; i < N; ++i) {
		iter++;
		temp = obj->x[offset+i];

		for (j = 0; j < ip; ++j) {
			temp = temp - phi[j] * obj->x[offset + i - j - 1];
		}

		if (i - ncond < iq) {
			jm = i - ncond;
		}
		else {
			jm = iq;
		}

		for (j = 0; j < jm; ++j) {
			temp = temp - theta[j] * obj->x[offset+N + i - j - 1];
		}

		obj->x[offset+N + i] = temp;
		ssq += temp * temp;
	}
	obj->ssq = ssq;
	value = 0.5 * log(ssq / (double)iter);
	obj->loglik = value;

	//printf("ssq %g %g \n", value,ssq);

	free(phi);
	free(theta);
	return value;
}